

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestList.cpp
# Opt level: O2

void __thiscall UnitTest::TestList::Add(TestList *this,Test *test)

{
  TestList *pTVar1;
  
  if (this->m_tail == (Test *)0x0) {
    pTVar1 = this;
    if (this->m_head != (Test *)0x0) {
      __assert_fail("m_head == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/TestList.cpp"
                    ,0x12,"void UnitTest::TestList::Add(Test *)");
    }
  }
  else {
    pTVar1 = (TestList *)&this->m_tail->next;
  }
  pTVar1->m_head = test;
  this->m_tail = test;
  return;
}

Assistant:

void TestList::Add(Test* test)
{
    if (m_tail == 0)
    {
        assert(m_head == 0);
        m_head = test;
        m_tail = test;
    }
    else
    {
        m_tail->next = test;
        m_tail = test;
    }
}